

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O0

void opj_tgt_encode(opj_bio_t *bio,opj_tgt_tree_t *tree,OPJ_UINT32 leafno,OPJ_INT32 threshold)

{
  int local_12c;
  opj_tgt_node_t *poStack_128;
  OPJ_INT32 low;
  opj_tgt_node_t *node;
  opj_tgt_node_t **stkptr;
  opj_tgt_node_t *stk [31];
  OPJ_INT32 threshold_local;
  OPJ_UINT32 leafno_local;
  opj_tgt_tree_t *tree_local;
  opj_bio_t *bio_local;
  
  node = (opj_tgt_node_t *)&stkptr;
  stk[0x1e]._0_4_ = threshold;
  stk[0x1e]._4_4_ = leafno;
  for (poStack_128 = tree->nodes + leafno; poStack_128->parent != (opj_tgt_node *)0x0;
      poStack_128 = poStack_128->parent) {
    node->parent = poStack_128;
    node = (opj_tgt_node_t *)&node->value;
  }
  local_12c = 0;
  do {
    if (poStack_128->low < local_12c) {
      poStack_128->low = local_12c;
    }
    else {
      local_12c = poStack_128->low;
    }
    for (; local_12c < (OPJ_INT32)stk[0x1e]; local_12c = local_12c + 1) {
      if (poStack_128->value <= local_12c) {
        if (poStack_128->known == 0) {
          opj_bio_write(bio,1,1);
          poStack_128->known = 1;
        }
        break;
      }
      opj_bio_write(bio,0,1);
    }
    poStack_128->low = local_12c;
    if (node == (opj_tgt_node_t *)&stkptr) {
      return;
    }
    poStack_128 = *(opj_tgt_node_t **)&node[-1].known;
    node = (opj_tgt_node_t *)&node[-1].known;
  } while( true );
}

Assistant:

void opj_tgt_encode(opj_bio_t *bio, opj_tgt_tree_t *tree, OPJ_UINT32 leafno, OPJ_INT32 threshold) {
        opj_tgt_node_t *stk[31];
        opj_tgt_node_t **stkptr;
        opj_tgt_node_t *node;
        OPJ_INT32 low;

        stkptr = stk;
        node = &tree->nodes[leafno];
        while (node->parent) {
                *stkptr++ = node;
                node = node->parent;
        }
        
        low = 0;
        for (;;) {
                if (low > node->low) {
                        node->low = low;
                } else {
                        low = node->low;
                }
                
                while (low < threshold) {
                        if (low >= node->value) {
                                if (!node->known) {
                                        opj_bio_write(bio, 1, 1);
                                        node->known = 1;
                                }
                                break;
                        }
                        opj_bio_write(bio, 0, 1);
                        ++low;
                }
                
                node->low = low;
                if (stkptr == stk)
                        break;
                node = *--stkptr;
        }
}